

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_Privkey_HexString_Test::~Privkey_Privkey_HexString_Test
          (Privkey_Privkey_HexString_Test *this)

{
  Privkey_Privkey_HexString_Test *this_local;
  
  ~Privkey_Privkey_HexString_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, Privkey_HexString) {
  std::string hex =
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  Privkey privkey(hex);
  EXPECT_STREQ(
      privkey.GetHex().c_str(),
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
}